

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O3

BIGNUM * BN_dup(BIGNUM *a)

{
  uint uVar1;
  BIGNUM *a_00;
  BIGNUM *pBVar2;
  
  if (a != (BIGNUM *)0x0) {
    uVar1 = a->flags;
    a_00 = (BIGNUM *)CRYPTO_zalloc(0x18);
    if (a_00 != (BIGNUM *)0x0) {
      a_00->flags = (uVar1 & 8) + 1;
      pBVar2 = BN_copy(a_00,a);
      if (pBVar2 != (BIGNUM *)0x0) {
        return a_00;
      }
      BN_free(a_00);
    }
  }
  return (BIGNUM *)0x0;
}

Assistant:

BIGNUM *BN_dup(const BIGNUM *a)
{
    BIGNUM *t;

    if (a == NULL)
        return NULL;
    bn_check_top(a);

    t = BN_get_flags(a, BN_FLG_SECURE) ? BN_secure_new() : BN_new();
    if (t == NULL)
        return NULL;
    if (!BN_copy(t, a)) {
        BN_free(t);
        return NULL;
    }
    bn_check_top(t);
    return t;
}